

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::EndElement(cmXMLWriter *this)

{
  ostream *poVar1;
  
  if (this->Indent != 0) {
    this->Indent = this->Indent - 1;
    if (this->ElementOpen == true) {
      std::operator<<(this->Output,"/>");
    }
    else {
      ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
      this->IsContent = false;
      poVar1 = std::operator<<(this->Output,"</");
      poVar1 = std::operator<<(poVar1,(string *)
                                      ((this->Elements).c.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + -1));
      std::operator<<(poVar1,'>');
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&(this->Elements).c);
    this->ElementOpen = false;
    return;
  }
  __assert_fail("this->Indent > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmXMLWriter.cxx"
                ,0x30,"void cmXMLWriter::EndElement()");
}

Assistant:

void cmXMLWriter::EndElement()
{
  assert(this->Indent > 0);
  --this->Indent;
  if (this->ElementOpen) {
    this->Output << "/>";
  } else {
    this->ConditionalLineBreak(!this->IsContent);
    this->IsContent = false;
    this->Output << "</" << this->Elements.top() << '>';
  }
  this->Elements.pop();
  this->ElementOpen = false;
}